

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void(std::error_code_const&)>::
callback<cppcms::util::details::binderX<cppcms::session_pool::gc_job,std::shared_ptr<cppcms::session_pool::gc_job>,std::error_code_const&>>
          (callback<void_(const_std::error_code_&)> *this,
          binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
          *func)

{
  callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
  *f;
  binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
  *in_RSI;
  binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
  *in_RDI;
  undefined1 add_ref;
  callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
  *this_00;
  
  f = (callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
       *)operator_new(0x30);
  this_00 = f;
  cppcms::util::details::
  binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
  ::binderX(in_RSI,in_RDI);
  add_ref = (undefined1)((ulong)in_RSI >> 0x38);
  callback<void_(const_std::error_code_&)>::
  callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
  ::callable_impl(this_00,(binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
                           *)f);
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)this_00,
             &f->super_callable_type,(bool)add_ref);
  cppcms::util::details::
  binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
  ::~binderX((binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
              *)0x43569e);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}